

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFS.h
# Opt level: O0

bool dg::pta::PointerAnalysisFS::pointsToAllocationInLoop(PSNode *n)

{
  bool bVar1;
  Pointer *ptr;
  const_iterator __end2;
  const_iterator __begin2;
  PointsToSetT *__range2;
  const_iterator *in_stack_ffffffffffffff98;
  Pointer in_stack_ffffffffffffffa0;
  Pointer *this;
  
  PointerIdPointsToSet::begin((PointerIdPointsToSet *)in_stack_ffffffffffffffa0.target);
  PointerIdPointsToSet::end((PointerIdPointsToSet *)in_stack_ffffffffffffffa0.target);
  while( true ) {
    bVar1 = PointerIdPointsToSet::const_iterator::operator!=
                      ((const_iterator *)in_stack_ffffffffffffffa0.target,in_stack_ffffffffffffff98)
    ;
    if (!bVar1) {
      return false;
    }
    in_stack_ffffffffffffffa0 =
         PointerIdPointsToSet::const_iterator::operator*(in_stack_ffffffffffffff98);
    this = (Pointer *)&stack0xffffffffffffffa0;
    bVar1 = Pointer::isValid((Pointer *)in_stack_ffffffffffffffa0.target);
    if (((bVar1) && (bVar1 = Pointer::isInvalidated(this), !bVar1)) &&
       (bVar1 = isOnLoop(in_stack_ffffffffffffffa0.target), bVar1)) break;
    PointerIdPointsToSet::const_iterator::operator++((const_iterator *)this);
  }
  return true;
}

Assistant:

static bool pointsToAllocationInLoop(PSNode *n) {
        for (const auto &ptr : n->pointsTo) {
            // skip invalidated, null and unknown memory
            if (!ptr.isValid() || ptr.isInvalidated())
                continue;

            if (isOnLoop(ptr.target))
                return true;
        }
        return false;
    }